

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::flatten_buffer_block(CompilerGLSL *this,VariableID id)

{
  SPIRVariable *pSVar1;
  SPIRType *pSVar2;
  mapped_type *pmVar3;
  runtime_error *prVar4;
  __hashtable *__h;
  __node_gen_type __node_gen;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uint32_t local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pSVar1 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      id.id);
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar1->super_IVariant).field_0xc);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&local_40,this,(ulong)(pSVar2->super_IVariant).self.id,0);
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,&(pSVar2->super_IVariant).self);
  if ((pSVar2->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_68,&local_40," is an array of UBOs.");
    ::std::runtime_error::runtime_error(prVar4,(string *)&local_68);
    *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)&(pSVar2->super_IVariant).field_0xc != 0xf) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_68,&local_40," is not a struct.");
    ::std::runtime_error::runtime_error(prVar4,(string *)&local_68);
    *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((pmVar3->decoration).decoration_flags.lower & 4) == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_68,&local_40," is not a block.");
    ::std::runtime_error::runtime_error(prVar4,(string *)&local_68);
    *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((pSVar2->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size != 0) {
    local_68._M_dataplus._M_p = (pointer)&this->flattened_buffer_blocks;
    local_44 = id.id;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_68,&local_40," is an empty struct.");
  ::std::runtime_error::runtime_error(prVar4,(string *)&local_68);
  *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
  __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::flatten_buffer_block(VariableID id)
{
	auto &var = get<SPIRVariable>(id);
	auto &type = get<SPIRType>(var.basetype);
	auto name = to_name(type.self, false);
	auto &flags = ir.meta[type.self].decoration.decoration_flags;

	if (!type.array.empty())
		SPIRV_CROSS_THROW(name + " is an array of UBOs.");
	if (type.basetype != SPIRType::Struct)
		SPIRV_CROSS_THROW(name + " is not a struct.");
	if (!flags.get(DecorationBlock))
		SPIRV_CROSS_THROW(name + " is not a block.");
	if (type.member_types.empty())
		SPIRV_CROSS_THROW(name + " is an empty struct.");

	flattened_buffer_blocks.insert(id);
}